

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O3

void tempseat_free(Seat *seat)

{
  SeatVtable *ptr;
  
  if (seat->vt == &tempseat_vt) {
    bufchain_clear((bufchain *)(seat + -9));
    while (ptr = seat[-4].vt, ptr != (SeatVtable *)0x0) {
      seat[-4].vt = (SeatVtable *)ptr->output;
      safefree(ptr);
    }
    safefree(seat + -10);
    return;
  }
  __assert_fail("seat->vt == &tempseat_vt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tempseat.c"
                ,0x17a,"void tempseat_free(Seat *)");
}

Assistant:

void tempseat_free(Seat *seat)
{
    assert(seat->vt == &tempseat_vt);
    TempSeat *ts = container_of(seat, TempSeat, seat);
    bufchain_clear(&ts->output);
    while (ts->outchunk_head) {
        struct output_chunk *chunk = ts->outchunk_head;
        ts->outchunk_head = chunk->next;
        sfree(chunk);
    }
    sfree(ts);
}